

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

back_insert_iterator<fmt::v7::detail::buffer<char>_>
fmt::v7::detail::
write_ptr<char,std::back_insert_iterator<fmt::v7::detail::buffer<char>>,unsigned_long>
          (back_insert_iterator<fmt::v7::detail::buffer<char>_> out,unsigned_long value,
          basic_format_specs<char> *specs)

{
  iterator it;
  int value_00;
  type tVar1;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> it_00;
  long in_RDX;
  anon_class_16_2_92d121e5 *in_RSI;
  buffer<char> *in_RDI;
  anon_class_16_2_92d121e5 write;
  size_t size;
  int num_digits;
  anon_class_16_2_92d121e5 *in_stack_ffffffffffffffa0;
  size_t in_stack_ffffffffffffffa8;
  basic_format_specs<char> *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffcc;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> local_10;
  buffer<char> *local_8;
  
  local_10.container = in_RDI;
  value_00 = count_digits<4u,unsigned_long>((unsigned_long)in_RSI);
  tVar1 = to_unsigned<int>(value_00);
  if (in_RDX == 0) {
    reserve<std::back_insert_iterator<fmt::v7::detail::buffer<char>>>(&local_10,(ulong)tVar1 + 2);
    it.container._4_4_ = in_stack_ffffffffffffffcc;
    it.container._0_4_ = value_00;
    it_00 = write_ptr<char,_std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_unsigned_long>
            ::anon_class_16_2_92d121e5::operator()(in_RSI,it);
    local_8 = (buffer<char> *)
              base_iterator<std::back_insert_iterator<fmt::v7::detail::buffer<char>>>
                        (local_10,it_00);
  }
  else {
    local_8 = (buffer<char> *)
              write_padded<(fmt::v7::align::type)2,std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char,fmt::v7::detail::write_ptr<char,std::back_insert_iterator<fmt::v7::detail::buffer<char>>,unsigned_long>(std::back_insert_iterator<fmt::v7::detail::buffer<char>>,unsigned_long,fmt::v7::basic_format_specs<char>const*)::_lambda(std::back_insert_iterator<fmt::v7::detail::buffer<char>>)_1_&>
                        (local_10,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                         in_stack_ffffffffffffffa0);
  }
  return (back_insert_iterator<fmt::v7::detail::buffer<char>_>)local_8;
}

Assistant:

OutputIt write_ptr(OutputIt out, UIntPtr value,
                   const basic_format_specs<Char>* specs) {
  int num_digits = count_digits<4>(value);
  auto size = to_unsigned(num_digits) + size_t(2);
  using iterator = remove_reference_t<decltype(reserve(out, 0))>;
  auto write = [=](iterator it) {
    *it++ = static_cast<Char>('0');
    *it++ = static_cast<Char>('x');
    return format_uint<4, Char>(it, value, num_digits);
  };
  return specs ? write_padded<align::right>(out, *specs, size, write)
               : base_iterator(out, write(reserve(out, size)));
}